

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int ncnn::get_big_cpu_count(void)

{
  undefined8 in_RAX;
  int big_cpu_count;
  CpuSet *unaff_retaddr;
  undefined4 local_8;
  
  try_initialize_global_cpu_info();
  get_cpu_thread_affinity_mask((int)((ulong)in_RAX >> 0x20));
  local_8 = CpuSet::num_enabled(unaff_retaddr);
  if (local_8 == 0) {
    local_8 = g_cpucount;
  }
  return local_8;
}

Assistant:

int get_big_cpu_count()
{
    try_initialize_global_cpu_info();
    int big_cpu_count = get_cpu_thread_affinity_mask(2).num_enabled();
    return big_cpu_count ? big_cpu_count : g_cpucount;
}